

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

JavascriptString * __thiscall Js::ScriptContext::GetIntegerString(ScriptContext *this,int value)

{
  bool bVar1;
  int iVar2;
  JavascriptLibrary *this_00;
  CharStringCache *this_01;
  Cache *pCVar3;
  BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar4;
  Recycler *pRVar5;
  BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  uint local_a0;
  int local_9c;
  char16 local_98 [2];
  int pos;
  char16 stringBuffer [22];
  StringMap *integerStringMap;
  TrackAllocData local_50;
  ScriptContext *local_28;
  JavascriptString *string;
  ScriptContext *pSStack_18;
  int value_local;
  ScriptContext *this_local;
  
  string._4_4_ = value;
  pSStack_18 = this;
  if ((value < 0) || (9 < value)) {
    pCVar3 = Cache(this);
    ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                        ((WriteBarrierPtr *)&pCVar3->integerStringMap);
    if (*ppBVar4 ==
        (BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      pRVar5 = GetRecycler(this);
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_50,
                 (type_info *)
                 &JsUtil::
                  BaseDictionary<unsigned_int,Js::JavascriptString*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::typeinfo,0,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                 ,0x742);
      pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_50);
      this_02 = (BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 *)new<Memory::Recycler>(0x38,pRVar5,0x43c4b0);
      pRVar5 = GetRecycler(this);
      JsUtil::
      BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::BaseDictionary(this_02,pRVar5,0);
      pCVar3 = Cache(this);
      Memory::
      WriteBarrierPtr<JsUtil::BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::operator=(&pCVar3->integerStringMap,this_02);
    }
    pCVar3 = Cache(this);
    ppBVar4 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                        ((WriteBarrierPtr *)&pCVar3->integerStringMap);
    unique0x00012000 = *ppBVar4;
    bVar1 = JsUtil::
            BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<int>(unique0x00012000,(int *)((long)&string + 4),
                               (JavascriptString **)&local_28);
    if (bVar1) {
      if (this->integerStringMapCacheUseCount < 0x30) {
        this->integerStringMapCacheUseCount = this->integerStringMapCacheUseCount + 1;
      }
    }
    else {
      if (0x400 < this->integerStringMapCacheMissCount) {
        this->integerStringMapCacheMissCount = 0;
        if (0x2f < this->integerStringMapCacheUseCount) {
          JsUtil::
          BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Clear(stack0xffffffffffffff98);
        }
        this->integerStringMapCacheUseCount = 0;
      }
      iVar2 = JsUtil::
              BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::Count(stack0xffffffffffffff98);
      if (iVar2 < 0x401) {
        local_9c = TaggedInt::ToBuffer(string._4_4_,local_98,0x16);
        local_28 = (ScriptContext *)
                   JavascriptString::NewCopyBuffer(local_98 + local_9c,0x15 - local_9c,this);
        local_a0 = string._4_4_;
        JsUtil::
        BaseDictionary<unsigned_int,_Js::JavascriptString_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
        ::AddNew(stack0xffffffffffffff98,&local_a0,(JavascriptString **)&local_28);
      }
      else {
        local_28 = (ScriptContext *)TaggedInt::ToString(string._4_4_,this);
        this->integerStringMapCacheMissCount = this->integerStringMapCacheMissCount + 1;
      }
    }
    this_local = local_28;
  }
  else {
    this_00 = GetLibrary(this);
    this_01 = JavascriptLibrary::GetCharStringCache(this_00);
    this_local = (ScriptContext *)
                 CharStringCache::GetStringForCharA(this_01,(char)string._4_4_ + '0');
  }
  return (JavascriptString *)this_local;
}

Assistant:

JavascriptString* ScriptContext::GetIntegerString(int value)
    {
        // Optimize for 0-9
        if (0 <= value && value <= 9)
        {
            return GetLibrary()->GetCharStringCache().GetStringForCharA('0' + static_cast<char>(value));
        }

        JavascriptString *string;

// TODO: (obastemur) Could this be dynamic instead of compile time?
#ifndef CC_LOW_MEMORY_TARGET // we don't need this on a target with low memory
#define NUMBER_TO_STRING_CACHE_SIZE 1024
#define NUMBER_TO_STRING_RE_CACHE_LIMIT 1024
#define NUMBER_TO_STRING_RE_CACHE_REASON_LIMIT 48
        if (this->Cache()->integerStringMap == nullptr)
        {
            this->Cache()->integerStringMap = RecyclerNew(GetRecycler(), StringMap, GetRecycler());
        }
        StringMap * integerStringMap = this->Cache()->integerStringMap;
        if (!integerStringMap->TryGetValue(value, &string))
        {
            // Add the string to hash table cache
            // limit the htable size to NUMBER_TO_STRING_CACHE_SIZE and refresh the cache often
            // however don't re-cache if we didn't use it much! App may not be suitable for caching.
            // 4% -> NUMBER_TO_STRING_RE_CACHE_REASON_LIMIT is equal to perf loss while we cache the stuff
            if (integerStringMapCacheMissCount > NUMBER_TO_STRING_RE_CACHE_LIMIT)
            {
                integerStringMapCacheMissCount = 0;
                if (integerStringMapCacheUseCount >= NUMBER_TO_STRING_RE_CACHE_REASON_LIMIT)
                {
                    integerStringMap->Clear();
                }
                integerStringMapCacheUseCount = 0;
            }

            if (integerStringMap->Count() > NUMBER_TO_STRING_CACHE_SIZE)
            {
#endif
                // Use recycler memory
                string = TaggedInt::ToString(value, this);
#ifndef CC_LOW_MEMORY_TARGET
                integerStringMapCacheMissCount++;
            }
            else
            {
                char16 stringBuffer[22];

                int pos = TaggedInt::ToBuffer(value, stringBuffer, _countof(stringBuffer));
                string = JavascriptString::NewCopyBuffer(stringBuffer + pos, (_countof(stringBuffer) - 1) - pos, this);
                integerStringMap->AddNew(value, string);
            }
        }
        else if (integerStringMapCacheUseCount < NUMBER_TO_STRING_RE_CACHE_REASON_LIMIT)
        {
            integerStringMapCacheUseCount++;
        }
#endif

        return string;
    }